

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SQLiteBuildDB.cpp
# Opt level: O2

void __thiscall anon_unknown.dwarf_415bfe::SQLiteBuildDB::dump(SQLiteBuildDB *this,raw_ostream *os)

{
  int iVar1;
  char *data;
  longlong lVar2;
  raw_ostream *prVar3;
  longlong N;
  longlong N_00;
  int __oflag;
  sqlite3_stmt *stmt;
  SQLiteBuildDB *local_88;
  pthread_mutex_t *local_80;
  double local_78;
  string local_70;
  string error;
  
  local_80 = (pthread_mutex_t *)&this->dbMutex;
  std::mutex::lock((mutex *)&local_80->__data);
  error._M_dataplus._M_p = (pointer)&error.field_2;
  error._M_string_length = 0;
  error.field_2._M_local_buf[0] = '\0';
  iVar1 = open(this,(char *)&error,__oflag);
  if ((char)iVar1 == '\0') {
    prVar3 = llvm::raw_ostream::operator<<(os,"error: ");
    (anonymous_namespace)::SQLiteBuildDB::getCurrentErrorMessage_abi_cxx11_(&local_70,this);
    prVar3 = llvm::raw_ostream::operator<<(prVar3,&local_70);
    llvm::raw_ostream::operator<<(prVar3,"\n");
    std::__cxx11::string::_M_dispose();
  }
  else {
    iVar1 = sqlite3_prepare_v2(this->db,"SELECT key, id FROM key_names;",0xffffffffffffffff,&stmt,0)
    ;
    if (iVar1 == 0) {
      local_88 = this;
      llvm::raw_ostream::operator<<(os,"keys:\n");
      while( true ) {
        iVar1 = sqlite3_step(stmt);
        if (iVar1 != 100) break;
        iVar1 = sqlite3_column_count();
        if (iVar1 != 2) {
          __assert_fail("sqlite3_column_count(stmt) == 2",
                        "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/Core/SQLiteBuildDB.cpp"
                        ,0x33d,
                        "virtual void (anonymous namespace)::SQLiteBuildDB::dump(raw_ostream &)");
        }
        iVar1 = sqlite3_column_bytes(stmt,0);
        data = (char *)sqlite3_column_text(stmt,0);
        lVar2 = sqlite3_column_int64(stmt,1);
        prVar3 = llvm::raw_ostream::operator<<(os,lVar2);
        prVar3 = llvm::raw_ostream::operator<<(prVar3," -- ");
        llbuild::core::KeyType::KeyType((KeyType *)&local_70,data,(long)iVar1);
        prVar3 = llvm::raw_ostream::operator<<(prVar3,local_70._M_dataplus._M_p);
        llvm::raw_ostream::operator<<(prVar3,"\n");
        std::__cxx11::string::_M_dispose();
      }
      sqlite3_finalize(stmt);
      iVar1 = sqlite3_prepare_v2(local_88->db,
                                 "SELECT key_id, built_at, computed_at, start, end FROM rule_results;"
                                 ,0xffffffffffffffff,&stmt,0);
      if (iVar1 == 0) {
        llvm::raw_ostream::operator<<(os,"\nresults:\n");
        while( true ) {
          iVar1 = sqlite3_step(stmt);
          if (iVar1 != 100) break;
          iVar1 = sqlite3_column_count();
          if (iVar1 != 5) {
            __assert_fail("sqlite3_column_count(stmt) == 5",
                          "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/Core/SQLiteBuildDB.cpp"
                          ,0x351,
                          "virtual void (anonymous namespace)::SQLiteBuildDB::dump(raw_ostream &)");
          }
          lVar2 = sqlite3_column_int64(stmt,0);
          N = sqlite3_column_int64(stmt,1);
          N_00 = sqlite3_column_int64(stmt,2);
          local_88 = (SQLiteBuildDB *)sqlite3_column_double(stmt,3);
          local_78 = (double)sqlite3_column_double(stmt,4);
          prVar3 = llvm::raw_ostream::operator<<(os,lVar2);
          prVar3 = llvm::raw_ostream::operator<<(prVar3," -- ");
          prVar3 = llvm::raw_ostream::operator<<(prVar3,N);
          prVar3 = llvm::raw_ostream::operator<<(prVar3,", ");
          prVar3 = llvm::raw_ostream::operator<<(prVar3,N_00);
          prVar3 = llvm::raw_ostream::operator<<(prVar3,", ");
          prVar3 = llvm::raw_ostream::operator<<(prVar3,local_78 - (double)local_88);
          llvm::raw_ostream::operator<<(prVar3,"s\n");
        }
        sqlite3_finalize(stmt);
      }
    }
  }
  std::__cxx11::string::_M_dispose();
  pthread_mutex_unlock(local_80);
  return;
}

Assistant:

virtual void dump(raw_ostream& os) override {
    std::lock_guard<std::mutex> guard(dbMutex);

    std::string error;
    if (!open(&error)) {
      os << "error: " << getCurrentErrorMessage() << "\n";
      return;
    }

    // Dump Keys
    int result;
    sqlite3_stmt* stmt;
    result = sqlite3_prepare_v2(db, "SELECT key, id FROM key_names;",
                                -1, &stmt, nullptr);
    if (result != SQLITE_OK)
      return;

    os << "keys:\n";
    while (sqlite3_step(stmt) == SQLITE_ROW) {
      assert(sqlite3_column_count(stmt) == 2);

      auto size = sqlite3_column_bytes(stmt, 0);
      auto text = (const char*) sqlite3_column_text(stmt, 0);

      auto id = sqlite3_column_int64(stmt, 1);

      os << id << " -- " << KeyType(text, size).c_str() << "\n";
    }

    sqlite3_finalize(stmt);

    // Dump Keys
    result = sqlite3_prepare_v2(db, "SELECT key_id, built_at, computed_at, start, end FROM rule_results;",
                                -1, &stmt, nullptr);
    if (result != SQLITE_OK)
      return;

    os << "\nresults:\n";
    while (sqlite3_step(stmt) == SQLITE_ROW) {
      assert(sqlite3_column_count(stmt) == 5);

      auto id = sqlite3_column_int64(stmt, 0);
      auto built = sqlite3_column_int64(stmt, 1);
      auto computed = sqlite3_column_int64(stmt, 2);
      auto start = sqlite3_column_double(stmt, 3);
      auto end = sqlite3_column_double(stmt, 4);

      os << id << " -- " << built << ", " << computed << ", " << end-start << "s\n";
    }

    sqlite3_finalize(stmt);
  }